

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_suite::random_access_iterator_index(void)

{
  reference piVar1;
  reference piVar2;
  initializer_list<int> __l;
  undefined4 local_64;
  iterator local_60;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&local_60);
  span.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  span.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  span.member.size = span.member.cap;
  span.member.next = span.member.cap;
  local_60 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator[]
                     (&local_60,2);
  local_64 = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.begin()[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xe3,"void concept_suite::random_access_iterator_index()",piVar1,&local_64);
  local_60 = (iterator)vista::circular_view<int,_18446744073709551615UL>::cbegin(&span);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator[]
                     ((basic_iterator<const_int> *)&local_60,2);
  local_64 = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.cbegin()[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xe4,"void concept_suite::random_access_iterator_index()",piVar2,&local_64);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void random_access_iterator_index()
{
    // a[n]
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    BOOST_TEST_EQ(span.begin()[2], 33);
    BOOST_TEST_EQ(span.cbegin()[2], 33);
}